

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O3

void __thiscall
QtMWidgets::MsgBoxTitle::MsgBoxTitle(MsgBoxTitle *this,QString *title,QWidget *parent)

{
  Data *pDVar1;
  MsgBoxTitlePrivate *this_00;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_001957f0;
  *(undefined ***)&this->field_0x10 = &PTR__MsgBoxTitle_001959a0;
  this_00 = (MsgBoxTitlePrivate *)operator_new(0x40);
  this_00->q = this;
  pDVar1 = (title->d).d;
  (this_00->title).d.d = pDVar1;
  (this_00->title).d.ptr = (title->d).ptr;
  (this_00->title).d.size = (title->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_00->margin = 10;
  (this_00->preparedTitle).d.d = (Data *)0x0;
  (this_00->preparedTitle).d.ptr = (char16_t *)0x0;
  (this_00->preparedTitle).d.size = 0;
  (this->d).d = this_00;
  MsgBoxTitlePrivate::init(this_00,(EVP_PKEY_CTX *)parent);
  return;
}

Assistant:

explicit MsgBoxTitle( const QString & title, QWidget * parent = 0 )
		:	QWidget( parent )
		,	d( new MsgBoxTitlePrivate( title, this ) )
	{
		d->init();
	}